

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlen.c
# Opt level: O1

_Bool ptrlen_contains_only(ptrlen input,char *characters)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  
  sVar3 = input.len;
  pcVar4 = (char *)input.ptr;
  bVar5 = (long)sVar3 < 1;
  if ((0 < (long)sVar3) && (pcVar1 = strchr(characters,(int)*pcVar4), pcVar1 != (char *)0x0)) {
    pcVar1 = pcVar4 + sVar3;
    do {
      pcVar4 = pcVar4 + 1;
      bVar5 = pcVar1 <= pcVar4;
      if (bVar5) {
        return bVar5;
      }
      pcVar2 = strchr(characters,(int)*pcVar4);
    } while (pcVar2 != (char *)0x0);
  }
  return bVar5;
}

Assistant:

bool ptrlen_contains_only(ptrlen input, const char *characters)
{
    for (const char *p = input.ptr, *end = p + input.len; p < end; p++)
        if (!strchr(characters, *p))
            return false;
    return true;
}